

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O1

void __thiscall soul::ScopedTimer::~ScopedTimer(ScopedTimer *this)

{
  pointer pcVar1;
  double dVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *local_58 [2];
  long local_48 [2];
  ScopedTimer *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  bVar3 = Logger::isLoggingEnabled();
  if (bVar3) {
    pcVar1 = (this->description)._M_dataplus._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + (this->description)._M_string_length);
    uStack_30 = 0;
    pcStack_20 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_Timing.cpp:40:5)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_Timing.cpp:40:5)>
               ::_M_manager;
    local_38 = this;
    dVar2 = Logger::log(0.0);
    if (local_28 != (code *)0x0) {
      (*local_28)(SUB84(dVar2,0),&local_38,&local_38,3);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  pcVar1 = (this->description)._M_dataplus._M_p;
  paVar4 = &(this->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ScopedTimer::~ScopedTimer()
{
    SOUL_LOG (description, [&] { return getElapsedTimeDescription(); });
}